

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O2

void __thiscall FIX::Session::reset(Session *this)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  generateLogout(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  disconnect(this);
  std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_38,&this->m_timestamper);
  SessionState::reset(&this->m_state,(UtcTimeStamp *)&local_38);
  return;
}

Assistant:

void reset() EXCEPT(IOException) {
    generateLogout();
    disconnect();
    m_state.reset(m_timestamper());
  }